

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O2

bool crnlib::uint_to_string(uint value,char *pDst,uint len)

{
  bool bVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char buf [16];
  
  pcVar4 = buf + 0xf;
  buf[0xf] = '\0';
  uVar3 = 1;
  do {
    pcVar4[-1] = (byte)((ulong)value % 10) | 0x30;
    pcVar4 = pcVar4 + -1;
    uVar3 = uVar3 + 1;
    bVar1 = 9 < value;
    value = value / 10;
  } while (bVar1);
  if (uVar3 <= len) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      pDst[uVar2] = *pcVar4;
      pcVar4 = pcVar4 + 1;
    }
  }
  return uVar3 <= len;
}

Assistant:

bool uint_to_string(uint value, char* pDst, uint len)
    {
        CRNLIB_ASSERT(pDst);

        const uint cBufSize = 16;
        char buf[cBufSize];

        char* p = buf + cBufSize - 1;

        *p-- = '\0';

        do
        {
            *p-- = static_cast<uint8>('0' + (value % 10));
            value /= 10;
        } while (value);

        const size_t total_bytes = (buf + cBufSize - 1) - p;
        if (total_bytes > len)
        {
            return false;
        }

        for (size_t i = 0; i < total_bytes; i++)
        {
            pDst[i] = p[1 + i];
        }

        return true;
    }